

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::SetPathDependentInfo(GlobOpt *this,bool conditionToBranch,PathDependentInfo *info)

{
  Instr *pIVar1;
  code *pcVar2;
  NodeBase *pNVar3;
  bool bVar4;
  BOOL BVar5;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  Type *ppFVar7;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  BasicBlock *pBVar8;
  undefined1 local_48 [8];
  Iterator __iter;
  
  if ((this->currentBlock->succList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
      super_RealCount.count != 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x28a6,"(this->currentBlock->GetSuccList()->Count() == 2)",
                       "this->currentBlock->GetSuccList()->Count() == 2");
    if (!bVar4) goto LAB_004697e5;
    *puVar6 = 0;
  }
  pBVar8 = this->currentBlock;
  do {
    pBVar8 = pBVar8->next;
    if (pBVar8 == (BasicBlock *)0x0) break;
  } while ((pBVar8->field_0x18 & 1) != 0);
  pIVar1 = pBVar8->firstInstr;
  local_48 = (undefined1  [8])&this->currentBlock->succList;
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48;
  __iter.current = (NodeBase *)this;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  while( true ) {
    if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_004697e5;
      *puVar6 = 0;
    }
    pNVar3 = __iter.current;
    __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_48) break;
    ppFVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    if (((*ppFVar7)->succBlock->firstInstr == pIVar1) != conditionToBranch) {
      FlowEdge::SetPathDependentInfo(*ppFVar7,info,(JitArenaAllocator *)__iter.current[0x13].next);
      return;
    }
  }
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  BVar5 = Func::HasTry((Func *)__iter.current[0x15].next);
  if (BVar5 != 0) {
    return;
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody((JITTimeWorkItem *)pNVar3[0x15].next[4].next);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo((JITTimeWorkItem *)pNVar3[0x15].next[4].next);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,FGPeepsPhase,sourceContextId,functionId);
  if (bVar4) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                     ,0x28b3,
                     "(this->func->HasTry() || Js::Configuration::Global.flags.Off.IsEnabled(((Js::FGPeepsPhase)), ((this->func)->GetSourceContextId()), ((this->func)->GetLocalFunctionId())))"
                     ,"this->func->HasTry() || PHASE_OFF(Js::FGPeepsPhase, this->func)");
  if (bVar4) {
    *puVar6 = 0;
    return;
  }
LAB_004697e5:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void
GlobOpt::SetPathDependentInfo(const bool conditionToBranch, const PathDependentInfo &info)
{
    Assert(this->currentBlock->GetSuccList()->Count() == 2);
    IR::Instr * fallthrough = this->currentBlock->GetNext()->GetFirstInstr();
    FOREACH_SLISTBASECOUNTED_ENTRY(FlowEdge*, edge, this->currentBlock->GetSuccList())
    {
        if (conditionToBranch == (edge->GetSucc()->GetFirstInstr() != fallthrough))
        {
            edge->SetPathDependentInfo(info, alloc);
            return;
        }
    }
    NEXT_SLISTBASECOUNTED_ENTRY;

    // In case flowgraph peeps is disabled, we could have conditional branch to next instr
    Assert(this->func->HasTry() || PHASE_OFF(Js::FGPeepsPhase, this->func));
}